

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lysp_check_dup_typedefs(lysp_ctx *ctx,lysp_module *mod)

{
  ly_ht *tpdfs_global;
  lysp_tpdf *plVar1;
  ulong local_80;
  ulong local_70;
  ulong local_60;
  ulong local_50;
  LY_ERR local_40;
  uint local_3c;
  LY_ERR ret;
  uint32_t i;
  uint64_t v;
  uint64_t u;
  lysp_tpdf *typedefs;
  ly_ht *ids_global;
  lysp_module *mod_local;
  lysp_ctx *ctx_local;
  
  local_40 = LY_SUCCESS;
  tpdfs_global = lyht_new(8,8,lysp_id_cmp,(void *)0x0,1);
  _ret = 0;
  while( true ) {
    if (mod->typedefs == (lysp_tpdf *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = *(ulong *)&mod->typedefs[-1].flags;
    }
    if (local_50 <= _ret) break;
    local_40 = lysp_check_dup_typedef(ctx,(lysp_node *)0x0,mod->typedefs + _ret,tpdfs_global);
    if (local_40 != LY_SUCCESS) goto LAB_0019e1ad;
    _ret = _ret + 1;
  }
  _ret = 0;
  while( true ) {
    if (mod->includes == (lysp_include *)0x0) {
      local_60 = 0;
    }
    else {
      local_60 = *(ulong *)(mod->includes[-1].rev + 8);
    }
    if (local_60 <= _ret) break;
    v = 0;
    while( true ) {
      if ((mod->includes[_ret].submodule)->typedefs == (lysp_tpdf *)0x0) {
        local_70 = 0;
      }
      else {
        local_70 = *(ulong *)&(mod->includes[_ret].submodule)->typedefs[-1].flags;
      }
      if (local_70 <= v) break;
      local_40 = lysp_check_dup_typedef
                           (ctx,(lysp_node *)0x0,(mod->includes[_ret].submodule)->typedefs + v,
                            tpdfs_global);
      if (local_40 != LY_SUCCESS) goto LAB_0019e1ad;
      v = v + 1;
    }
    _ret = _ret + 1;
  }
  for (local_3c = 0; local_3c < (ctx->tpdfs_nodes).count; local_3c = local_3c + 1) {
    plVar1 = lysp_node_typedefs((lysp_node *)(ctx->tpdfs_nodes).field_2.dnodes[local_3c]);
    v = 0;
    while( true ) {
      if (plVar1 == (lysp_tpdf *)0x0) {
        local_80 = 0;
      }
      else {
        local_80 = *(ulong *)&plVar1[-1].flags;
      }
      if (local_80 <= v) break;
      local_40 = lysp_check_dup_typedef
                           (ctx,(lysp_node *)(ctx->tpdfs_nodes).field_2.dnodes[local_3c],plVar1 + v,
                            tpdfs_global);
      if (local_40 != LY_SUCCESS) goto LAB_0019e1ad;
      v = v + 1;
    }
  }
LAB_0019e1ad:
  lyht_free(tpdfs_global,(_func_void_void_ptr *)0x0);
  return local_40;
}

Assistant:

LY_ERR
lysp_check_dup_typedefs(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    struct ly_ht *ids_global;
    const struct lysp_tpdf *typedefs;
    LY_ARRAY_COUNT_TYPE u, v;
    uint32_t i;
    LY_ERR ret = LY_SUCCESS;

    /* check name collisions - typedefs and groupings */
    ids_global = lyht_new(LYHT_MIN_SIZE, sizeof(char *), lysp_id_cmp, NULL, 1);
    LY_ARRAY_FOR(mod->typedefs, v) {
        ret = lysp_check_dup_typedef(ctx, NULL, &mod->typedefs[v], ids_global);
        LY_CHECK_GOTO(ret, cleanup);
    }
    LY_ARRAY_FOR(mod->includes, v) {
        LY_ARRAY_FOR(mod->includes[v].submodule->typedefs, u) {
            ret = lysp_check_dup_typedef(ctx, NULL, &mod->includes[v].submodule->typedefs[u], ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }
    for (i = 0; i < ctx->tpdfs_nodes.count; ++i) {
        typedefs = lysp_node_typedefs((struct lysp_node *)ctx->tpdfs_nodes.objs[i]);
        LY_ARRAY_FOR(typedefs, u) {
            ret = lysp_check_dup_typedef(ctx, (struct lysp_node *)ctx->tpdfs_nodes.objs[i], &typedefs[u], ids_global);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ids_global, NULL);
    return ret;
}